

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::ComputeHomeRelativeOutputPath(cmLocalUnixMakefileGenerator3 *this)

{
  string *this_00;
  int iVar1;
  char *pcVar2;
  allocator local_7a;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  pcVar2 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&local_58,pcVar2,&local_79);
  pcVar2 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&local_78,pcVar2,&local_7a);
  MaybeConvertToRelativePath(&local_38,this,&local_58,&local_78);
  this_00 = &this->HomeRelativeOutputPath;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  iVar1 = std::__cxx11::string::compare((char *)this_00);
  if (iVar1 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)this_00,0,(char *)(this->HomeRelativeOutputPath)._M_string_length,0x66eafa);
  }
  if ((this->HomeRelativeOutputPath)._M_string_length != 0) {
    std::__cxx11::string::append((char *)this_00);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::ComputeHomeRelativeOutputPath()
{
  // Compute the path to use when referencing the current output
  // directory from the top output directory.
  this->HomeRelativeOutputPath = this->MaybeConvertToRelativePath(
    this->GetBinaryDirectory(), this->GetCurrentBinaryDirectory());
  if (this->HomeRelativeOutputPath == ".") {
    this->HomeRelativeOutputPath = "";
  }
  if (!this->HomeRelativeOutputPath.empty()) {
    this->HomeRelativeOutputPath += "/";
  }
}